

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5ApiColumnText(Fts5Context *pCtx,int iCol,char **pz,int *pn)

{
  int iVar1;
  char **in_RCX;
  undefined8 *in_RDX;
  int in_ESI;
  Fts5Config *in_RDI;
  Fts5Table *pTab;
  Fts5Cursor *pCsr;
  int rc;
  uint in_stack_ffffffffffffffd8;
  int iVar2;
  undefined4 in_stack_fffffffffffffff0;
  
  iVar2 = 0;
  if ((in_ESI < 0) || (*(int *)((long)&in_RDI->db->mutex->mutex + 0x20) <= in_ESI)) {
    iVar2 = 0x19;
  }
  else {
    iVar1 = fts5IsContentless((Fts5FullTable *)in_RDI->db,0);
    if (iVar1 == 0) {
      iVar2 = fts5SeekCursor((Fts5Cursor *)pz,pn._4_4_);
      if (iVar2 == 0) {
        iVar2 = fts5TextFromStmt(in_RDI,(sqlite3_stmt *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                                 (int)((ulong)in_RDX >> 0x20),in_RCX,
                                 (int *)(ulong)in_stack_ffffffffffffffd8);
        sqlite3Fts5ClearLocale((Fts5Config *)0x283a84);
      }
    }
    else {
      *in_RDX = 0;
      *(undefined4 *)in_RCX = 0;
    }
  }
  return iVar2;
}

Assistant:

static int fts5ApiColumnText(
  Fts5Context *pCtx,
  int iCol,
  const char **pz,
  int *pn
){
  int rc = SQLITE_OK;
  Fts5Cursor *pCsr = (Fts5Cursor*)pCtx;
  Fts5Table *pTab = (Fts5Table*)(pCsr->base.pVtab);

  assert( pCsr->ePlan!=FTS5_PLAN_SPECIAL );
  if( iCol<0 || iCol>=pTab->pConfig->nCol ){
    rc = SQLITE_RANGE;
  }else if( fts5IsContentless((Fts5FullTable*)(pCsr->base.pVtab), 0) ){
    *pz = 0;
    *pn = 0;
  }else{
    rc = fts5SeekCursor(pCsr, 0);
    if( rc==SQLITE_OK ){
      rc = fts5TextFromStmt(pTab->pConfig, pCsr->pStmt, iCol, pz, pn);
      sqlite3Fts5ClearLocale(pTab->pConfig);
    }
  }
  return rc;
}